

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O3

void png_write_finish_row(png_structrp png_ptr)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar5 = png_ptr->row_number + 1;
  png_ptr->row_number = uVar5;
  if (uVar5 < png_ptr->num_rows) {
    return;
  }
  if (png_ptr->interlaced != '\0') {
    png_ptr->row_number = 0;
    if ((png_ptr->transformations & 2) == 0) {
      bVar3 = png_ptr->pass + 1;
      do {
        bVar4 = bVar3;
        if (6 < bVar4) break;
        bVar1 = "\b\b\x04\x04\x02\x02\x01"[bVar4];
        uVar7 = ~(uint)""[bVar4] + png_ptr->width + (uint)bVar1;
        png_ptr->usr_width = uVar7 / bVar1;
        bVar2 = "\b\b\b\x04\x04\x02\x02"[bVar4];
        uVar5 = ~(uint)""[bVar4] + png_ptr->height + (uint)bVar2;
        png_ptr->num_rows = uVar5 / bVar2;
        bVar3 = bVar4 + 1;
      } while ((uVar7 < bVar1) || (uVar5 < bVar2));
    }
    else {
      bVar4 = png_ptr->pass + 1;
    }
    png_ptr->pass = bVar4;
    if (bVar4 < 7) {
      if (png_ptr->prev_row == (png_bytep)0x0) {
        return;
      }
      uVar5 = (uint)png_ptr->usr_bit_depth * (uint)png_ptr->usr_channels;
      if (uVar5 < 8) {
        uVar6 = (ulong)png_ptr->width * (ulong)uVar5 + 7 >> 3;
      }
      else {
        uVar6 = (ulong)png_ptr->width * (ulong)(uVar5 >> 3);
      }
      memset(png_ptr->prev_row,0,uVar6 + 1);
      return;
    }
  }
  png_compress_IDAT(png_ptr,(png_const_bytep)0x0,0,4);
  return;
}

Assistant:

void /* PRIVATE */
png_write_finish_row(png_structrp png_ptr)
{
#ifdef PNG_WRITE_INTERLACING_SUPPORTED
   /* Arrays to facilitate easy interlacing - use pass (0 - 6) as index */

   /* Start of interlace block */
   static const png_byte png_pass_start[7] = {0, 4, 0, 2, 0, 1, 0};

   /* Offset to next interlace block */
   static const png_byte png_pass_inc[7] = {8, 8, 4, 4, 2, 2, 1};

   /* Start of interlace block in the y direction */
   static const png_byte png_pass_ystart[7] = {0, 0, 4, 0, 2, 0, 1};

   /* Offset to next interlace block in the y direction */
   static const png_byte png_pass_yinc[7] = {8, 8, 8, 4, 4, 2, 2};
#endif

   png_debug(1, "in png_write_finish_row");

   /* Next row */
   png_ptr->row_number++;

   /* See if we are done */
   if (png_ptr->row_number < png_ptr->num_rows)
      return;

#ifdef PNG_WRITE_INTERLACING_SUPPORTED
   /* If interlaced, go to next pass */
   if (png_ptr->interlaced != 0)
   {
      png_ptr->row_number = 0;
      if ((png_ptr->transformations & PNG_INTERLACE) != 0)
      {
         png_ptr->pass++;
      }

      else
      {
         /* Loop until we find a non-zero width or height pass */
         do
         {
            png_ptr->pass++;

            if (png_ptr->pass >= 7)
               break;

            png_ptr->usr_width = (png_ptr->width +
                png_pass_inc[png_ptr->pass] - 1 -
                png_pass_start[png_ptr->pass]) /
                png_pass_inc[png_ptr->pass];

            png_ptr->num_rows = (png_ptr->height +
                png_pass_yinc[png_ptr->pass] - 1 -
                png_pass_ystart[png_ptr->pass]) /
                png_pass_yinc[png_ptr->pass];

            if ((png_ptr->transformations & PNG_INTERLACE) != 0)
               break;

         } while (png_ptr->usr_width == 0 || png_ptr->num_rows == 0);

      }

      /* Reset the row above the image for the next pass */
      if (png_ptr->pass < 7)
      {
         if (png_ptr->prev_row != NULL)
            memset(png_ptr->prev_row, 0,
                PNG_ROWBYTES(png_ptr->usr_channels *
                png_ptr->usr_bit_depth, png_ptr->width) + 1);

         return;
      }
   }
#endif

   /* If we get here, we've just written the last row, so we need
      to flush the compressor */
   png_compress_IDAT(png_ptr, NULL, 0, Z_FINISH);
}